

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fill_system_smooth.c
# Opt level: O0

void fill_system(Sparse_matrix *lh_side,double *rh_side,Grid *grid,Node_status *node_status,
                Gas_parameters *gas_parameters,double *space_coordinates,uint time_step,double *G,
                double *V)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Node_status NVar5;
  uint uVar6;
  double value;
  double value_00;
  double dVar7;
  double dVar8;
  double dVar9;
  double value_01;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double mu_tilda_rev_hh_4_3;
  double viscosity_norm;
  double rev_tau;
  double rev_hh_4_3;
  double rev_h_6;
  double rev_h_4;
  double rev_h_2;
  double rev_h;
  uint row_number;
  uint space_step;
  double *space_coordinates_local;
  Gas_parameters *gas_parameters_local;
  Node_status *node_status_local;
  Grid *grid_local;
  double *rh_side_local;
  Sparse_matrix *lh_side_local;
  
  rev_h._0_4_ = 0;
  value = 1.0 / grid->X_step;
  value_00 = value * 0.5;
  dVar7 = value * 0.25;
  dVar8 = value / 6.0;
  dVar9 = (value * value * 4.0) / 3.0;
  value_01 = 1.0 / grid->T_step;
  dVar11 = gas_parameters->viscosity;
  dVar10 = function_norm_C(G,grid->X_nodes,exp_1);
  dVar11 = dVar11 * dVar10;
  dVar10 = dVar11 * dVar9;
  Sparse_matrix_Clear(lh_side);
  for (rev_h._4_4_ = 0; rev_h._4_4_ < grid->X_nodes; rev_h._4_4_ = rev_h._4_4_ + 1) {
    NVar5 = node_status[rev_h._4_4_];
    if (NVar5 == LEFT) {
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,0,value_01 - value_00 * *V);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,1,-value);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,2,value_00 * V[1]);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,3,value);
      dVar1 = *G;
      dVar2 = G[1];
      dVar3 = *V;
      dVar12 = V[1];
      dVar4 = G[2];
      dVar13 = V[2];
      dVar14 = rhs_1st_equation(space_coordinates[rev_h._4_4_],(double)time_step * grid->T_step,
                                gas_parameters);
      rh_side[rev_h._0_4_] =
           dVar7 * ((2.0 - dVar1) * ((dVar13 - (dVar12 + dVar12)) + dVar3) +
                   dVar1 * dVar3 + (dVar4 * dVar13 - (dVar2 + dVar2) * dVar12)) +
           value_01 * dVar1 + value_00 * dVar1 * (dVar12 - dVar3) + dVar14;
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_ + 1,1,1.0);
      rh_side[rev_h._0_4_ + 1] = 0.0;
      rev_h._0_4_ = rev_h._0_4_ + 2;
    }
    else if (NVar5 == MIDDLE) {
      Sparse_matrix_Append_element
                (lh_side,rev_h._0_4_,rev_h._4_4_ * 2 - 2,
                 -dVar7 * V[rev_h._4_4_] - dVar7 * V[rev_h._4_4_ - 1]);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,rev_h._4_4_ * 2 - 1,-value_00);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,rev_h._4_4_ * 2,value_01);
      Sparse_matrix_Append_element
                (lh_side,rev_h._0_4_,rev_h._4_4_ * 2 + 2,
                 dVar7 * V[rev_h._4_4_] + dVar7 * V[rev_h._4_4_ + 1]);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,rev_h._4_4_ * 2 + 3,value_00);
      dVar1 = G[rev_h._4_4_];
      dVar2 = V[rev_h._4_4_ + 1];
      dVar3 = V[rev_h._4_4_ - 1];
      dVar12 = rhs_1st_equation(space_coordinates[rev_h._4_4_],(double)time_step * grid->T_step,
                                gas_parameters);
      rh_side[rev_h._0_4_] = value_01 * dVar1 + dVar7 * dVar1 * (dVar2 - dVar3) + dVar12;
      uVar6 = rev_h._0_4_ + 1;
      Sparse_matrix_Append_element
                (lh_side,uVar6,rev_h._4_4_ * 2 - 2,-value_00 * gas_parameters->p_ro);
      Sparse_matrix_Append_element
                (lh_side,uVar6,rev_h._4_4_ * 2 - 1,
                 (-dVar8 * V[rev_h._4_4_] - dVar8 * V[rev_h._4_4_ - 1]) - dVar10);
      Sparse_matrix_Append_element(lh_side,uVar6,rev_h._4_4_ * 2 + 1,dVar10 + dVar10 + value_01);
      Sparse_matrix_Append_element
                (lh_side,uVar6,rev_h._4_4_ * 2 + 2,value_00 * gas_parameters->p_ro);
      Sparse_matrix_Append_element
                (lh_side,uVar6,rev_h._4_4_ * 2 + 3,
                 (dVar8 * V[rev_h._4_4_] + dVar8 * V[rev_h._4_4_ + 1]) - dVar10);
      dVar1 = V[rev_h._4_4_];
      dVar2 = gas_parameters->viscosity;
      dVar13 = exp_1(G[rev_h._4_4_]);
      dVar3 = V[rev_h._4_4_ - 1];
      dVar12 = V[rev_h._4_4_];
      dVar4 = V[rev_h._4_4_ + 1];
      dVar14 = rhs_2nd_equation(space_coordinates[rev_h._4_4_],(double)time_step * grid->T_step,
                                gas_parameters);
      rh_side[uVar6] =
           (value_01 * dVar1 -
           dVar9 * (dVar11 - dVar2 * dVar13) * ((dVar3 - (dVar12 + dVar12)) + dVar4)) + dVar14;
      rev_h._0_4_ = rev_h._0_4_ + 2;
    }
    else if (NVar5 == RIGHT) {
      Sparse_matrix_Append_element
                (lh_side,rev_h._0_4_,grid->X_nodes * 2 - 4,-value_00 * V[grid->X_nodes - 2]);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,grid->X_nodes * 2 - 3,-value);
      Sparse_matrix_Append_element
                (lh_side,rev_h._0_4_,grid->X_nodes * 2 - 2,
                 value_00 * V[grid->X_nodes - 1] + value_01);
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_,grid->X_nodes * 2 - 1,value);
      uVar6 = grid->X_nodes;
      dVar1 = G[uVar6 - 1];
      dVar2 = V[uVar6 - 1];
      dVar3 = V[uVar6 - 2];
      dVar12 = G[uVar6 - 2];
      dVar4 = G[uVar6 - 3];
      dVar13 = V[uVar6 - 3];
      dVar14 = rhs_1st_equation(space_coordinates[rev_h._4_4_],(double)time_step * grid->T_step,
                                gas_parameters);
      rh_side[rev_h._0_4_] =
           ((value_01 * dVar1 + value_00 * dVar1 * (dVar2 - dVar3)) -
           dVar7 * ((2.0 - dVar1) * ((dVar2 - (dVar3 + dVar3)) + dVar13) +
                   dVar4 * dVar13 + (dVar1 * dVar2 - (dVar12 + dVar12) * dVar3))) + dVar14;
      Sparse_matrix_Append_element(lh_side,rev_h._0_4_ + 1,(grid->X_nodes - 1) * 2 + 1,1.0);
      rh_side[rev_h._0_4_ + 1] = 0.0;
      rev_h._0_4_ = rev_h._0_4_ + 2;
    }
  }
  Sparse_matrix_Finish_filling(lh_side);
  return;
}

Assistant:

void fill_system (
    Sparse_matrix * lh_side,
    double * rh_side,
    Grid const * grid,
    Node_status const * node_status,
    Gas_parameters const * gas_parameters,
    double const * space_coordinates,
    unsigned const time_step,
    double const * G,
    double const * V) {

  unsigned space_step = 0,
  // iterator through rows
           row_number = 0;

  // auxiliary constants
  double const rev_h   = 1. / grid->X_step,
         rev_h_2 = .5 * rev_h,
         rev_h_4 = .25 * rev_h,
         rev_h_6 = rev_h / 6.,
         rev_hh_4_3 = rev_h * rev_h * 4. / 3.,

         rev_tau = 1. / grid->T_step;

  double const viscosity_norm =
    gas_parameters->viscosity * function_norm_C (G, grid->X_nodes, exp_1);

  double const mu_tilda_rev_hh_4_3 = viscosity_norm * rev_hh_4_3;

  Sparse_matrix_Clear (lh_side);

  for (space_step = 0; space_step < grid->X_nodes; ++space_step) {
    switch (node_status[space_step]) {
      case LEFT:
        MATRIX_APPEND (G_INDEX(0), rev_tau - rev_h_2 * V[0]);
        MATRIX_APPEND (V_INDEX(0), -rev_h);
        MATRIX_APPEND (G_INDEX(1), rev_h_2 * V[1]);
        MATRIX_APPEND (V_INDEX(1), rev_h);

        rh_side[row_number] = rev_tau * G[0] +
                   rev_h_2 * G[0] * (V[1] - V[0]) +
                   rev_h_4 *
                     (G[2] * V[2] - 2 * G[1] * V[1] + G[0] * V[0] +
                       (2 - G[0]) * (V[2] - 2 * V[1] + V[0])) +
                   rhs_1st_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;

        /* dummy equation */

        MATRIX_APPEND (V_INDEX(0), 1);
        rh_side[row_number] = 0;
        ++row_number;
        break;

      case MIDDLE:
        MATRIX_APPEND (G_INDEX(space_step - 1), -rev_h_4 * V[space_step] - rev_h_4 * V[space_step - 1]);
        MATRIX_APPEND (V_INDEX(space_step - 1), -rev_h_2);
        MATRIX_APPEND (G_INDEX(space_step), rev_tau);
        MATRIX_APPEND (G_INDEX(space_step + 1), rev_h_4 * V[space_step] + rev_h_4 * V[space_step + 1]);
        MATRIX_APPEND (V_INDEX(space_step + 1), rev_h_2);

        rh_side[row_number] = rev_tau * G[space_step] +
                   rev_h_4 * G[space_step] * (V[space_step + 1] - V[space_step - 1]) +
                   rhs_1st_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;
        /* another equation */
        /* attention: these values should be changed when (viscosity != 0) */
        MATRIX_APPEND (G_INDEX(space_step - 1), -rev_h_2 * gas_parameters->p_ro);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step - 1), -rev_h_6 * V[space_step] - rev_h_6 * V[space_step - 1] - mu_tilda_rev_hh_4_3);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step), rev_tau + 2 * mu_tilda_rev_hh_4_3);
        MATRIX_APPEND (G_INDEX(space_step + 1), rev_h_2 * gas_parameters->p_ro);
        // change me!
        MATRIX_APPEND (V_INDEX(space_step + 1), rev_h_6 * V[space_step] + rev_h_6 * V[space_step + 1] - mu_tilda_rev_hh_4_3);
        // change me!
        rh_side[row_number] = rev_tau * V[space_step] -
                  rev_hh_4_3 *
                    (viscosity_norm - gas_parameters->viscosity * exp_1 (G[space_step])) *
                    (V[space_step - 1] - 2 * V[space_step] + V[space_step + 1]) +
                  rhs_2nd_equation (space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;
        break;

      case RIGHT:
        MATRIX_APPEND (G_INDEX(grid->X_nodes - 2), -rev_h_2 * V[grid->X_nodes - 2]);
        MATRIX_APPEND (V_INDEX(grid->X_nodes - 2), -rev_h);
        MATRIX_APPEND (G_INDEX(grid->X_nodes - 1), rev_tau + rev_h_2 * V[grid->X_nodes - 1]);
        MATRIX_APPEND (V_INDEX(grid->X_nodes - 1), rev_h);

        rh_side[row_number] = rev_tau * G[grid->X_nodes - 1] +
                   rev_h_2 * G[grid->X_nodes - 1] * (V[grid->X_nodes - 1] - V[grid->X_nodes - 2]) -
                   rev_h_4 *
                     (G[grid->X_nodes - 1] * V[grid->X_nodes - 1] -
                      2 * G[grid->X_nodes - 2] * V[grid->X_nodes - 2] +
                      G[grid->X_nodes - 3] * V[grid->X_nodes - 3] +
                        (2 - G[grid->X_nodes - 1]) *
                        (V[grid->X_nodes - 1] - 2 * V[grid->X_nodes - 2] + V[grid->X_nodes - 3])) +
                   rhs_1st_equation(space_coordinates[space_step], time_step * grid->T_step, gas_parameters);
        ++row_number;

        /* dummy equation */

        MATRIX_APPEND (V_INDEX(grid->X_nodes - 1), 1);
        rh_side[row_number] = 0;
        ++row_number;
        break;

      default:
        break;
    }
  }

  Sparse_matrix_Finish_filling (lh_side);
  return;
}